

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Vec_Int_t *pVVar1;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  abctime aVar12;
  abctime aVar13;
  int *piVar14;
  int *piVar15;
  abctime aVar16;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar17;
  int local_70;
  uint local_6c;
  int nEdgesCur;
  int nDelayCur;
  int value;
  int iLit;
  int nConfAft;
  int nConfBef;
  int LitCount;
  int Count_1;
  int nEntries;
  int nIters;
  int nConfTotal;
  int StartSol;
  int Count;
  int Root;
  int status;
  int i;
  abctime clk2;
  abctime clk;
  int fKeepTrying;
  int iPivot_local;
  Sbl_Man_t *p_local;
  
  clk._0_4_ = 1;
  aVar12 = Abc_Clock();
  nEntries = 0;
  Count_1 = 0;
  iVar3 = Hsh_VecSize(p->pHash);
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar4 = Sbl_ManWindow2(p,iPivot);
  if (iVar4 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",(ulong)(uint)iPivot,
             (ulong)(uint)p->nVars);
    }
    p->nSmallWins = p->nSmallWins + 1;
    p_local._4_4_ = 0;
  }
  else {
    Hsh_VecManAdd(p->pHash,p->vAnds);
    iVar4 = Hsh_VecSize(p->pHash);
    if (iVar3 == iVar4) {
      if (p->fVeryVerbose != 0) {
        printf("Obj %d: This window was already tried.\n",(ulong)(uint)iPivot);
      }
      p->nHashWins = p->nHashWins + 1;
      p_local._4_4_ = 0;
    }
    else {
      if (p->fVeryVerbose != 0) {
        uVar5 = Vec_IntSize(p->vLeaves);
        uVar6 = Vec_IntSize(p->vAnds);
        uVar7 = Vec_IntSize(p->vRoots);
        uVar8 = Vec_IntSize(p->vNodes);
        printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",
               (ulong)(uint)iPivot,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
      }
      iVar3 = Vec_IntSize(p->vLeaves);
      if ((iVar3 < 0x81) && (iVar3 = Vec_IntSize(p->vAnds), iVar3 <= p->nVars)) {
        iVar3 = Vec_IntSize(p->vAnds);
        if (iVar3 < 10) {
          if (p->fVeryVerbose != 0) {
            printf("Skipping.\n");
          }
          p_local._4_4_ = 0;
        }
        else {
          Sbl_ManComputeCuts(p);
          Sbl_ManCreateCnf(p);
          if (p->fVeryVeryVerbose != 0) {
            uVar5 = sat_solver_nclauses(p->pSat);
            uVar6 = Vec_IntSize(p->vAnds);
            iVar3 = Vec_WrdSize(p->vCutsI1);
            iVar4 = Vec_IntSize(p->vAnds);
            iVar9 = sat_solver_nclauses(p->pSat);
            iVar10 = Vec_WrdSize(p->vCutsI1);
            printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n"
                   ,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(iVar3 - iVar4),
                   (ulong)(uint)(iVar9 - iVar10));
          }
          Vec_IntClear(p->vAssump);
          Vec_IntPush(p->vAssump,-1);
          for (Root = Vec_IntSize(p->vAnds); Root < p->Power2; Root = Root + 1) {
            pVVar1 = p->vAssump;
            iVar3 = Abc_Var2Lit(Root,1);
            Vec_IntPush(pVVar1,iVar3);
          }
          for (Root = 0; iVar3 = Vec_IntSize(p->vRootVars), Root < iVar3; Root = Root + 1) {
            iVar3 = Vec_IntEntry(p->vRootVars,Root);
            pVVar1 = p->vAssump;
            iVar3 = Abc_Var2Lit(iVar3,0);
            Vec_IntPush(pVVar1,iVar3);
          }
          iVar3 = Vec_IntSize(p->vSolInit);
          iVar3 = iVar3 + 1;
          do {
            uVar17 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
            if ((int)clk == 0 || iVar3 - (int)clk < 1) goto LAB_009b8c5a;
            nConfBef = 0;
            nConfAft = 0;
            if (p->fVeryVerbose != 0) {
              printf("Trying to find mapping with %d LUTs.\n",(ulong)(uint)(iVar3 - (int)clk));
            }
            pVVar1 = p->vAssump;
            iVar4 = Vec_IntEntry(p->vCardVars,iVar3 - (int)clk);
            iVar4 = Abc_Var2Lit(iVar4,1);
            Vec_IntWriteEntry(pVVar1,0,iVar4);
            aVar13 = Abc_Clock();
            iVar4 = (int)(p->pSat->stats).conflicts;
            psVar2 = p->pSat;
            piVar14 = Vec_IntArray(p->vAssump);
            piVar15 = Vec_IntLimit(p->vAssump);
            in_stack_fffffffffffffec8 = 0;
            iVar9 = sat_solver_solve(psVar2,piVar14,piVar15,(long)p->nBTLimit,0,0,0);
            aVar16 = Abc_Clock();
            p->timeSat = (aVar16 - aVar13) + p->timeSat;
            iVar10 = (int)(p->pSat->stats).conflicts;
            nEntries = (iVar10 - iVar4) + nEntries;
            Count_1 = Count_1 + 1;
            p->nRuns = p->nRuns + 1;
            if (iVar9 == 1) {
              aVar16 = Abc_Clock();
              p->timeSatSat = (aVar16 - aVar13) + p->timeSatSat;
            }
            else if (iVar9 == -1) {
              aVar16 = Abc_Clock();
              p->timeSatUns = (aVar16 - aVar13) + p->timeSatUns;
            }
            else {
              aVar16 = Abc_Clock();
              p->timeSatUnd = (aVar16 - aVar13) + p->timeSatUnd;
            }
            uVar17 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
            if (iVar9 == 0) goto LAB_009b8c5a;
            if (iVar9 == 1) {
              if (p->fVeryVeryVerbose != 0) {
                for (Root = 0; iVar11 = Vec_IntSize(p->vAnds), Root < iVar11; Root = Root + 1) {
                  uVar5 = sat_solver_var_value(p->pSat,Root);
                  printf("%d",(ulong)uVar5);
                }
                printf("\n");
                for (Root = 0; iVar11 = Vec_IntSize(p->vAnds), Root < iVar11; Root = Root + 1) {
                  iVar11 = sat_solver_var_value(p->pSat,Root);
                  if (iVar11 != 0) {
                    uVar5 = sat_solver_var_value(p->pSat,Root);
                    printf("%d=%d ",(ulong)(uint)Root,(ulong)uVar5);
                    nConfBef = nConfBef + 1;
                  }
                }
                printf("Count = %d\n",(ulong)(uint)nConfBef);
              }
              nConfBef = 1;
              Vec_IntClear(p->vSolCur);
              for (Root = p->FirstVar; iVar11 = sat_solver_nvars(p->pSat), Root < iVar11;
                  Root = Root + 1) {
                iVar11 = sat_solver_var_value(p->pSat,Root);
                if (iVar11 != 0) {
                  if (p->fVeryVeryVerbose != 0) {
                    uVar5 = Vec_IntEntry(p->vCutsObj,Root - p->FirstVar);
                    pVVar1 = p->vAnds;
                    iVar11 = Vec_IntEntry(p->vCutsObj,Root - p->FirstVar);
                    uVar6 = Vec_IntEntry(pVVar1,iVar11);
                    printf("Cut %3d : Node = %3d %6d  ",(ulong)(uint)nConfBef,(ulong)uVar5,
                           (ulong)uVar6);
                    nConfBef = nConfBef + 1;
                  }
                  if (p->fVeryVeryVerbose != 0) {
                    iVar11 = Sbl_ManFindAndPrintCut(p,Root - p->FirstVar);
                    nConfAft = iVar11 + nConfAft;
                  }
                  Vec_IntPush(p->vSolCur,Root - p->FirstVar);
                }
              }
            }
            if (iVar9 == 1) {
              if ((p->fDelay == 0) || (iVar11 = Sbl_ManEvaluateMapping(p,p->DelayMax), iVar11 != 0))
              {
                Vec_IntClear(p->vSolBest);
                Vec_IntAppend(p->vSolBest,p->vSolCur);
                clk._0_4_ = (int)clk + 1;
              }
              else {
                if (p->fVeryVerbose != 0) {
                  uVar5 = Vec_IntSize(p->vPath);
                  printf("Critical path of length (%d) is detected:   ",(ulong)uVar5);
                  for (Root = 0; iVar11 = Vec_IntSize(p->vPath), Root < iVar11; Root = Root + 1) {
                    iVar11 = Vec_IntEntry(p->vPath,Root);
                    pVVar1 = p->vAnds;
                    iVar11 = Abc_Lit2Var(iVar11);
                    uVar5 = Vec_IntEntry(pVVar1,iVar11);
                    printf("%d=%d ",(ulong)(uint)Root,(ulong)uVar5);
                  }
                  printf("\n");
                }
                psVar2 = p->pSat;
                piVar14 = Vec_IntArray(p->vPath);
                piVar15 = Vec_IntLimit(p->vPath);
                iVar11 = sat_solver_addclause(psVar2,piVar14,piVar15);
                if (iVar11 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                                ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
                }
              }
            }
            else {
              clk._0_4_ = 0;
            }
            if (p->fVeryVerbose != 0) {
              if (iVar9 == -1) {
                printf("UNSAT ");
              }
              else if (iVar9 == 1) {
                printf("SAT   ");
              }
              else {
                printf("UNDEC ");
              }
              printf("confl =%8d.    ",(ulong)(uint)(iVar10 - iVar4));
              aVar16 = Abc_Clock();
              Abc_PrintTime(1,"Time",aVar16 - aVar13);
              printf("Total ");
              printf("confl =%8d.    ",(ulong)(uint)nEntries);
              aVar13 = Abc_Clock();
              Abc_PrintTime(1,"Time",aVar13 - aVar12);
              if ((p->fVeryVeryVerbose != 0) && (iVar9 == 1)) {
                printf("LitCount = %d.\n",(ulong)(uint)nConfAft);
              }
              printf("\n");
            }
            uVar17 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
          } while (Count_1 != 10);
          p->nIterOuts = p->nIterOuts + 1;
LAB_009b8c5a:
          iVar3 = Vec_IntSize(p->vSolBest);
          if (0 < iVar3) {
            iVar3 = Vec_IntSize(p->vSolBest);
            iVar4 = Vec_IntSize(p->vSolInit);
            if (iVar3 < iVar4) {
              local_70 = 0;
              Sbl_ManUpdateMapping(p);
              if (p->pGia->vEdge1 == (Vec_Int_t *)0x0) {
                local_6c = Sbl_ManCreateTiming(p,p->DelayMax);
              }
              else {
                local_6c = Gia_ManEvalEdgeDelay(p->pGia);
                local_70 = Gia_ManEvalEdgeCount(p->pGia);
              }
              if (p->fVerbose != 0) {
                iVar3 = Vec_IntSize(p->vSolInit);
                iVar4 = Vec_IntSize(p->vSolBest);
                printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n"
                       ,(ulong)(uint)iPivot,(ulong)(uint)(iVar3 - iVar4),(ulong)(uint)nEntries,
                       (ulong)(uint)Count_1,(ulong)local_6c,CONCAT44(uVar17,local_70));
              }
              aVar12 = Abc_Clock();
              p->timeTotal = (aVar12 - p->timeStart) + p->timeTotal;
              p->nImproved = p->nImproved + 1;
              return 2;
            }
          }
          aVar12 = Abc_Clock();
          p->timeTotal = (aVar12 - p->timeStart) + p->timeTotal;
          p_local._4_4_ = 1;
        }
      }
      else {
        if (p->fVeryVerbose != 0) {
          uVar5 = Vec_IntSize(p->vLeaves);
          uVar6 = Vec_IntSize(p->vAnds);
          printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",
                 (ulong)(uint)iPivot,(ulong)uVar5,(ulong)uVar6);
        }
        p->nLargeWins = p->nLargeWins + 1;
        p_local._4_4_ = 0;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}